

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_buffer.h
# Opt level: O1

void __thiscall PenguinV_Image::ImageTemplate<int>::fill(ImageTemplate<int> *this,int value)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  FunctionFacade *this_00;
  _func_void_int_ptr_int_unsigned_long *UNRECOVERED_JUMPTABLE;
  
  piVar3 = this->_data;
  if (piVar3 != (int *)0x0) {
    uVar1 = this->_height;
    uVar2 = this->_rowSize;
    this_00 = FunctionFacade::instance();
    UNRECOVERED_JUMPTABLE =
         __PenguinV_Image__ImageTemplate<int>__FunctionFacade___getFunction<void(*)(int*,int,unsigned_long)>_std__vector<void(*)(int*,int,unsigned_long),std::allocator<void(*)(int*,int,unsigned_long)>>const__unsigned_char_const_
                   (this_00,&this_00->_set,this->_type);
    (*UNRECOVERED_JUMPTABLE)(piVar3,value,(ulong)uVar2 * (ulong)uVar1 * 4);
    return;
  }
  return;
}

Assistant:

bool empty() const
        {
            return _data == nullptr;
        }